

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.c
# Opt level: O1

void ethash_calculate_dag_item(node *ret,uint32_t node_index,ethash_light_t light)

{
  uint64_t *puVar1;
  uint uVar2;
  void *pvVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  uint64_t uVar9;
  uint64_t uVar10;
  uint w;
  long lVar11;
  uint32_t i;
  uint uVar12;
  ulong uVar13;
  
  pvVar3 = light->cache;
  uVar13 = light->cache_size >> 6;
  uVar12 = 0;
  lVar11 = ((ulong)node_index % (uVar13 & 0xffffffff)) * 0x40;
  uVar4 = ((uint64_t *)((long)pvVar3 + lVar11))[1];
  puVar1 = (uint64_t *)((long)pvVar3 + lVar11 + 0x10);
  uVar5 = *puVar1;
  uVar6 = puVar1[1];
  puVar1 = (uint64_t *)((long)pvVar3 + lVar11 + 0x20);
  uVar7 = *puVar1;
  uVar8 = puVar1[1];
  puVar1 = (uint64_t *)((long)pvVar3 + lVar11 + 0x30);
  uVar9 = *puVar1;
  uVar10 = puVar1[1];
  ret->double_words[0] = *(uint64_t *)((long)pvVar3 + lVar11);
  ret->double_words[1] = uVar4;
  ret->double_words[6] = uVar9;
  ret->double_words[7] = uVar10;
  ret->double_words[4] = uVar7;
  ret->double_words[5] = uVar8;
  ret->double_words[2] = uVar5;
  ret->double_words[3] = uVar6;
  ret->words[0] = ret->words[0] ^ node_index;
  sha3_512(ret->bytes,0x40,(uint8_t *)ret,0x40);
  do {
    uVar2 = ret->words[uVar12 & 0xf];
    lVar11 = 0;
    do {
      ret->words[lVar11] =
           ret->words[lVar11] * 0x1000193 ^
           *(uint *)((long)pvVar3 +
                    lVar11 * 4 +
                    ((ulong)((uVar12 ^ node_index) * 0x1000193 ^ uVar2) % (uVar13 & 0xffffffff)) *
                    0x40);
      lVar11 = lVar11 + 1;
    } while (lVar11 != 0x10);
    uVar12 = uVar12 + 1;
  } while (uVar12 != 0x100);
  sha3_512(ret->bytes,0x40,(uint8_t *)ret,0x40);
  return;
}

Assistant:

void ethash_calculate_dag_item(
	node* const ret,
	uint32_t node_index,
	ethash_light_t const light
)
{
	uint32_t num_parent_nodes = (uint32_t) (light->cache_size / sizeof(node));
	node const* cache_nodes = (node const *) light->cache;
	node const* init = &cache_nodes[node_index % num_parent_nodes];
	memcpy(ret, init, sizeof(node));
	ret->words[0] ^= node_index;
	SHA3_512(ret->bytes, ret->bytes, sizeof(node));
#if defined(_M_X64) && ENABLE_SSE
	__m128i const fnv_prime = _mm_set1_epi32(FNV_PRIME);
	__m128i xmm0 = ret->xmm[0];
	__m128i xmm1 = ret->xmm[1];
	__m128i xmm2 = ret->xmm[2];
	__m128i xmm3 = ret->xmm[3];
#endif

	for (uint32_t i = 0; i != ETHASH_DATASET_PARENTS; ++i) {
		uint32_t parent_index = fnv_hash(node_index ^ i, ret->words[i % NODE_WORDS]) % num_parent_nodes;
		node const *parent = &cache_nodes[parent_index];

#if defined(_M_X64) && ENABLE_SSE
		{
			xmm0 = _mm_mullo_epi32(xmm0, fnv_prime);
			xmm1 = _mm_mullo_epi32(xmm1, fnv_prime);
			xmm2 = _mm_mullo_epi32(xmm2, fnv_prime);
			xmm3 = _mm_mullo_epi32(xmm3, fnv_prime);
			xmm0 = _mm_xor_si128(xmm0, parent->xmm[0]);
			xmm1 = _mm_xor_si128(xmm1, parent->xmm[1]);
			xmm2 = _mm_xor_si128(xmm2, parent->xmm[2]);
			xmm3 = _mm_xor_si128(xmm3, parent->xmm[3]);

			// have to write to ret as values are used to compute index
			ret->xmm[0] = xmm0;
			ret->xmm[1] = xmm1;
			ret->xmm[2] = xmm2;
			ret->xmm[3] = xmm3;
		}
		#else
		{
			for (unsigned w = 0; w != NODE_WORDS; ++w) {
				ret->words[w] = fnv_hash(ret->words[w], parent->words[w]);
			}
		}
#endif
	}
	SHA3_512(ret->bytes, ret->bytes, sizeof(node));
}